

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# POSG.cpp
# Opt level: O2

void __thiscall POSG::SetDiscount(POSG *this,Index agentI,double d)

{
  reference pvVar1;
  E *this_00;
  
  if ((0.0 <= d) && (d <= 1.0)) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::at(&this->_m_discount,(ulong)agentI);
    *pvVar1 = d;
    return;
  }
  this_00 = (E *)__cxa_allocate_exception(0x28);
  E::E(this_00,"POSG::SetDiscount() discount not valid, should be >=0 and <=1");
  __cxa_throw(this_00,&E::typeinfo,E::~E);
}

Assistant:

void POSG::SetDiscount(Index agentI, double d)
{
    if(d>=0 && d<=1)
        _m_discount.at(agentI)=d;
    else
        throw(E("POSG::SetDiscount() discount not valid, should be >=0 and <=1"));
}